

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iptables.c
# Opt level: O3

void free_tables(ip_tables_t *ipts)

{
  ip_table_t *p;
  list_head *plVar1;
  int i;
  long lVar2;
  int i_1;
  long lVar3;
  list_head *plVar4;
  
  if (ipts != (ip_tables_t *)0x0) {
    lVar2 = 0;
    do {
      p = ipts->tables[lVar2];
      if (p != (ip_table_t *)0x0) {
        lVar3 = 0;
        do {
          free_chain(p->chains[lVar3]);
          p->chains[lVar3] = (ip_chain_t *)0x0;
          lVar3 = lVar3 + 1;
        } while (lVar3 != 5);
        plVar4 = (p->child_chains).next;
        while (plVar1 = plVar4 + -3, (ip_table_t *)&plVar1->prev != p) {
          plVar4 = plVar4->next;
          free_chain((ip_chain_t *)&plVar1->prev);
        }
        mwFree(p,"/workspace/llm4binary/github/license_all_cmakelists_25/Freeind[P]ita/iptables.c",
               0x7b);
      }
      ipts->tables[lVar2] = (ip_table_t *)0x0;
      lVar2 = lVar2 + 1;
    } while (lVar2 != 4);
    mwFree(ipts,"/workspace/llm4binary/github/license_all_cmakelists_25/Freeind[P]ita/iptables.c",
           0x89);
    return;
  }
  return;
}

Assistant:

void free_tables(ip_tables_t *ipts)
{
	if (ipts == NULL) {
		return;
	}

	for (int i = 0; i < TABLE_MAX; i++) {
		free_table(ipts->tables[i]);
		ipts->tables[i] = NULL;
	}

	_free(ipts);
}